

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

void __thiscall
fmt::v5::vprint<char[11],char>
          (v5 *this,FILE *f,text_style *ts,char (*format) [11],
          basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          args)

{
  FILE FVar1;
  int i;
  long lVar2;
  byte *pbVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  string_view format_str;
  string_view format_str_00;
  format_args args_00;
  format_args args_01;
  undefined4 local_48;
  byte local_44 [20];
  
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
              )args.types_;
  FVar1 = f[0x12];
  bVar10 = FVar1 != (FILE)0x0;
  if (bVar10) {
    local_48 = 0;
    bVar11 = ((byte)FVar1 & 1) != 0;
    if (bVar11) {
      local_48 = 1;
    }
    local_48 = (uint)bVar11;
    if (((byte)FVar1 & 2) != 0) {
      local_48._0_2_ = CONCAT11(3,bVar11);
      local_48 = (uint)(ushort)local_48;
    }
    if (((byte)FVar1 & 4) != 0) {
      local_48._0_3_ = CONCAT12(4,(ushort)local_48);
      local_48 = (uint)(uint3)local_48;
    }
    if (((byte)FVar1 & 8) != 0) {
      local_48 = CONCAT13(9,(uint3)local_48);
    }
    lVar2 = 0;
    lVar5 = 0;
    do {
      cVar7 = *(char *)((long)&local_48 + lVar2);
      if (cVar7 != '\0') {
        (local_44 + lVar5)[0] = 0x1b;
        (local_44 + lVar5)[1] = 0x5b;
        local_44[lVar5 + 2] = cVar7 + 0x30;
        local_44[lVar5 + 3] = 0x6d;
        lVar5 = lVar5 + 4;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    local_44[lVar5] = 0;
    fputs((char *)local_44,(FILE *)this);
  }
  if (f[0x10] == (FILE)0x1) {
    uVar6 = *(ulong *)f;
    if ((uVar6 & 1) == 0) {
      uVar6 = uVar6 >> 0x20 & 0xff;
      uVar8 = (uint)uVar6;
      lVar2 = 2;
      if (99 < uVar8) {
        local_44[2] = 0x31;
        uVar8 = uVar8 + (int)(uVar6 / 100) * -100;
        lVar2 = 3;
      }
      pbVar3 = local_44 + lVar2 + 3;
      local_44[lVar2] = (byte)((ulong)uVar8 / 10) | 0x30;
      local_44[lVar2 + 1] = (char)uVar8 + ((char)(uVar8 / 10) + (char)(uVar8 / 10)) * -5 | 0x30;
    }
    else {
      pbVar3 = local_44 + 0x13;
      local_44[2] = 0x33;
      local_44[3] = 0x38;
      local_44[4] = 0x3b;
      local_44[5] = 0x32;
      local_44[6] = 0x3b;
      uVar8 = (ushort)(uVar6 >> 0x30) & 0xff;
      local_44[7] = (byte)(uVar8 * 0x29 >> 0xc) | 0x30;
      uVar8 = uVar8 / 10;
      cVar7 = (char)uVar8;
      local_44[8] = cVar7 + ((byte)(uVar8 / 5) & 6) * -5 | 0x30;
      local_44[9] = (char)(uVar6 >> 0x30) + cVar7 * -10 | 0x30;
      local_44[10] = 0x3b;
      uVar8 = (uint)(uVar6 >> 0x20);
      uVar9 = uVar8 >> 8 & 0xff;
      local_44[0xb] = (byte)(uVar9 * 0x29 >> 0xc) | 0x30;
      uVar9 = uVar9 / 10;
      cVar7 = (char)uVar9;
      local_44[0xc] = cVar7 + ((byte)(uVar9 / 5) & 6) * -5 | 0x30;
      local_44[0xd] = (char)(uVar6 >> 0x28) + cVar7 * -10 | 0x30;
      local_44[0xe] = 0x3b;
      uVar8 = uVar8 & 0xff;
      local_44[0xf] = (byte)(uVar8 * 0x29 >> 0xc) | 0x30;
      uVar8 = uVar8 / 10;
      cVar7 = (char)uVar8;
      local_44[0x10] = cVar7 + ((byte)(uVar8 / 5) & 6) * -5 | 0x30;
      local_44[0x11] = (char)(uVar6 >> 0x20) + cVar7 * -10 | 0x30;
    }
    local_44[0] = 0x1b;
    local_44[1] = 0x5b;
    pbVar3[-1] = 0x6d;
    *pbVar3 = 0;
    fputs((char *)local_44,(FILE *)this);
    bVar10 = true;
  }
  if (f[0x11] == (FILE)0x1) {
    uVar6 = *(ulong *)(f + 8);
    uVar8 = (uint)(uVar6 >> 0x20);
    if ((uVar6 & 1) == 0) {
      uVar9 = (uVar8 & 0xff) + 10;
      lVar2 = 2;
      if (0x59 < (uVar8 & 0xff)) {
        local_44[2] = 0x31;
        uVar9 = uVar9 % 100;
        lVar2 = 3;
      }
      pbVar3 = local_44 + lVar2 + 3;
      local_44[lVar2] = (byte)((ulong)uVar9 / 10) | 0x30;
      local_44[lVar2 + 1] = (char)uVar9 + ((char)(uVar9 / 10) + (char)(uVar9 / 10)) * -5 | 0x30;
    }
    else {
      pbVar3 = local_44 + 0x13;
      local_44[2] = 0x34;
      local_44[3] = 0x38;
      local_44[4] = 0x3b;
      local_44[5] = 0x32;
      local_44[6] = 0x3b;
      uVar9 = (ushort)(uVar6 >> 0x30) & 0xff;
      local_44[7] = (byte)(uVar9 * 0x29 >> 0xc) | 0x30;
      uVar9 = uVar9 / 10;
      cVar7 = (char)uVar9;
      local_44[8] = cVar7 + ((byte)(uVar9 / 5) & 6) * -5 | 0x30;
      local_44[9] = (char)(uVar6 >> 0x30) + cVar7 * -10 | 0x30;
      local_44[10] = 0x3b;
      uVar9 = uVar8 >> 8 & 0xff;
      local_44[0xb] = (byte)(uVar9 * 0x29 >> 0xc) | 0x30;
      uVar9 = uVar9 / 10;
      cVar7 = (char)uVar9;
      local_44[0xc] = cVar7 + ((byte)(uVar9 / 5) & 6) * -5 | 0x30;
      local_44[0xd] = (char)(uVar6 >> 0x28) + cVar7 * -10 | 0x30;
      local_44[0xe] = 0x3b;
      local_44[0xf] = (byte)((uVar8 & 0xff) * 0x29 >> 0xc) | 0x30;
      uVar8 = (uVar8 & 0xff) / 10;
      cVar7 = (char)uVar8;
      local_44[0x10] = cVar7 + ((byte)(uVar8 / 5) & 6) * -5 | 0x30;
      local_44[0x11] = (char)(uVar6 >> 0x20) + cVar7 * -10 | 0x30;
    }
    local_44[0] = 0x1b;
    local_44[1] = 0x5b;
    pbVar3[-1] = 0x6d;
    *pbVar3 = 0;
    fputs((char *)local_44,(FILE *)this);
    sVar4 = strlen((char *)ts);
    format_str_00.size_ = sVar4;
    format_str_00.data_ = (char *)ts;
    args_01.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .field_1.values_ =
         args_00.
         super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         .field_1.values_;
    args_01.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .types_ = (unsigned_long_long)format;
    vprint((FILE *)this,format_str_00,args_01);
  }
  else {
    sVar4 = strlen((char *)ts);
    format_str.size_ = sVar4;
    format_str.data_ = (char *)ts;
    args_00.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .types_ = (unsigned_long_long)format;
    vprint((FILE *)this,format_str,args_00);
    if (!bVar10) {
      return;
    }
  }
  fputs("\x1b[0m",(FILE *)this);
  return;
}

Assistant:

void vprint(std::FILE *f, const text_style &ts, const S &format,
            basic_format_args<typename buffer_context<Char>::type> args) {
  bool has_style = false;
  if (ts.has_emphasis()) {
    has_style = true;
    internal::fputs<Char>(
          internal::make_emphasis<Char>(ts.get_emphasis()), f);
  }
  if (ts.has_foreground()) {
    has_style = true;
    internal::fputs<Char>(
          internal::make_foreground_color<Char>(ts.get_foreground()), f);
  }
  if (ts.has_background()) {
    has_style = true;
    internal::fputs<Char>(
        internal::make_background_color<Char>(ts.get_background()), f);
  }
  vprint(f, format, args);
  if (has_style) {
    internal::reset_color<Char>(f);
  }
}